

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

word If_ManSat6ComposeLut4(int t,word *f,int k)

{
  ulong local_40;
  ulong local_38;
  word r;
  word c;
  int nMints;
  int v;
  int m;
  int k_local;
  word *f_local;
  int t_local;
  
  local_38 = 0;
  if (4 < k) {
    __assert_fail("k <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSat.c"
                  ,0x6b,"word If_ManSat6ComposeLut4(int, word *, int)");
  }
  for (nMints = 0; nMints < 1 << ((byte)k & 0x1f); nMints = nMints + 1) {
    if ((t >> ((byte)nMints & 0x1f) & 1U) != 0) {
      r = 0xffffffffffffffff;
      for (c._4_4_ = 0; c._4_4_ < k; c._4_4_ = c._4_4_ + 1) {
        if ((nMints >> ((byte)c._4_4_ & 0x1f) & 1U) == 0) {
          local_40 = f[c._4_4_] ^ 0xffffffffffffffff;
        }
        else {
          local_40 = f[c._4_4_];
        }
        r = local_40 & r;
      }
      local_38 = r | local_38;
    }
  }
  return local_38;
}

Assistant:

static word If_ManSat6ComposeLut4( int t, word f[4], int k )
{
    int m, v, nMints = (1 << k);
    word c, r = 0;
    assert( k <= 4 );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c = ~(word)0;
        for ( v = 0; v < k; v++ )
            c &= ((m >> v) & 1) ? f[v] : ~f[v];
        r |= c;
    }
    return r;
}